

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall cfd::core::ConfidentialTransaction::RandomSortTxOut(ConfidentialTransaction *this)

{
  uint uVar1;
  CfdException *this_00;
  long lVar2;
  pointer pCVar3;
  size_t index;
  ulong uVar4;
  ulong uVar5;
  Amount AVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_158;
  ConfidentialValue local_140;
  ulong local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  Amount local_f8;
  Script local_e8;
  ByteData local_b0;
  ByteData local_98;
  ConfidentialNonce local_80;
  ConfidentialAssetId local_58;
  
  GetTxOutList(&local_158,this);
  if (local_158.
      super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_158.
      super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    pCVar3 = local_158.
             super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    lVar2 = 0x78;
    uVar5 = 0;
    do {
      ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&local_e8,
                 (ConfidentialValue *)
                 ((long)&((local_158.
                           super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOutReference)
                         ._vptr_AbstractTxOutReference + lVar2));
      if (1 < (byte)local_e8.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        local_140._vptr_ConfidentialValue = (_func_int **)0x5893e8;
        local_140.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xc23;
        local_140.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = "RandomSortTxOut";
        logger::log<>((CfdSourceLocation *)&local_140,kCfdLogLevelWarning,"already blinded tx");
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        local_140._vptr_ConfidentialValue =
             (_func_int **)
             ((long)&local_140.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 8);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"already blinded tx","");
        CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_140);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_e8._vptr_Script = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
      if (local_e8.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar5 = uVar5 + 1;
      uVar4 = ((long)local_158.
                     super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_158.
                     super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1084210842108421;
      lVar2 = lVar2 + 0xf8;
      pCVar3 = local_158.
               super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < uVar4);
  }
  if (uVar4 != 0) {
    do {
      AbstractTransaction::RemoveTxOut(&this->super_AbstractTransaction,(uint32_t)(uVar4 - 1));
      ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
      _M_erase(&this->vout_,
               (this->vout_).
               super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
               ._M_impl.super__Vector_impl_data._M_start + (uVar4 - 1 & 0xffffffff));
      uVar4 = uVar4 - 1;
      pCVar3 = local_158.
               super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 != 0);
  }
  RandomNumberUtil::GetRandomIndexes
            (&local_110,
             (int)((ulong)((long)local_158.
                                 super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) >> 3) *
             -0x42108421);
  if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      pCVar3 = local_158.
               super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4];
      local_118 = uVar4;
      ConfidentialValue::ConfidentialValue
                (&local_140,
                 &local_158.
                  super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar1].confidential_value_);
      AVar6 = ConfidentialValue::GetAmount(&local_140);
      local_f8.amount_ = AVar6.amount_;
      local_f8.ignore_check_ = AVar6.ignore_check_;
      ConfidentialAssetId::ConfidentialAssetId(&local_58,&pCVar3[uVar1].asset_);
      Script::Script(&local_e8,&pCVar3[uVar1].super_AbstractTxOutReference.locking_script_);
      ConfidentialNonce::ConfidentialNonce(&local_80,&pCVar3[uVar1].nonce_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_98.data_,&pCVar3[uVar1].surjection_proof_.data_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_b0.data_,&pCVar3[uVar1].range_proof_.data_);
      AddTxOut(this,&local_f8,&local_58,&local_e8,&local_80,&local_98,&local_b0);
      if (local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_80._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0068d410;
      if (local_80.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      Script::~Script(&local_e8);
      local_58._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0068d228;
      if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_140._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
      if ((void *)CONCAT44(local_140.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_140.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_140.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_140.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      uVar4 = local_118 + 1;
    } while (uVar4 < (ulong)((long)local_110.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_110.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(&local_158);
  return;
}

Assistant:

void ConfidentialTransaction::RandomSortTxOut() {
  const std::vector<ConfidentialTxOutReference> &txout_list = GetTxOutList();
  // blind check
  for (size_t index = 0; index < txout_list.size(); ++index) {
    const ConfidentialValue &value = txout_list[index].GetConfidentialValue();
    if (value.HasBlinding()) {
      warn(CFD_LOG_SOURCE, "already blinded tx");
      throw CfdException(kCfdIllegalArgumentError, "already blinded tx");
    }
  }
  for (size_t index = txout_list.size(); index > 0; --index) {
    RemoveTxOut(static_cast<uint32_t>(index - 1));
  }

  std::vector<uint32_t> indexes = RandomNumberUtil::GetRandomIndexes(
      static_cast<uint32_t>(txout_list.size()));
  for (size_t index = 0; index < indexes.size(); ++index) {
    const ConfidentialTxOutReference &txout = txout_list[indexes[index]];
    AddTxOut(
        txout.GetConfidentialValue().GetAmount(), txout.GetAsset(),
        txout.GetLockingScript(), txout.GetNonce(), txout.GetSurjectionProof(),
        txout.GetRangeProof());
  }
}